

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::GlobalType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
          *values,GlobalType *out,char *desc)

{
  uint uVar1;
  pointer pGVar2;
  bool bVar3;
  Result RVar4;
  Enum EVar5;
  Index IVar6;
  Var VStack_78;
  
  Var::Var(&VStack_78,var);
  RVar4 = CheckIndex(this,&VStack_78,
                     (int)((ulong)((long)(values->
                                         super__Vector_base<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(values->
                                        super__Vector_base<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 2) *
                     -0x55555555,desc);
  Var::~Var(&VStack_78);
  if (out != (GlobalType *)0x0) {
    if (RVar4.enum_ == Ok) {
      if (var->type_ != Index) {
        __assert_fail("is_index()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                      ,0x3b,"Index wabt::Var::index() const");
      }
      uVar1 = (var->field_2).index_;
      pGVar2 = (values->
               super__Vector_base<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
               )._M_impl.super__Vector_impl_data._M_start;
      EVar5 = pGVar2[uVar1].type.enum_;
      IVar6 = pGVar2[uVar1].type.type_index_;
      bVar3 = pGVar2[uVar1].mutable_;
    }
    else {
      bVar3 = true;
      EVar5 = Any;
      IVar6 = 0;
    }
    (out->type).enum_ = EVar5;
    (out->type).type_index_ = IVar6;
    out->mutable_ = bVar3;
  }
  return (Result)RVar4.enum_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}